

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::IsValid(ON_NurbsSurface *this,ON_TextLog *text_log)

{
  double *pdVar1;
  uint cv_count;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  int k;
  ulong uVar6;
  char *format;
  uint uVar7;
  int iVar8;
  int i;
  int j;
  ulong uVar9;
  
  if (this->m_dim < 1) {
    if (text_log != (ON_TextLog *)0x0) {
      format = "ON_NurbsSurface.m_dim = %d (should be > 0).\n";
      goto LAB_00555223;
    }
  }
  else {
    if (this->m_cv == (double *)0x0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_NurbsSurface.m_cv is nullptr.\n";
LAB_00555223:
      ON_TextLog::Print(text_log,format);
      return false;
    }
    bVar2 = true;
    uVar9 = 0;
    while ((uVar9 < 2 && (bVar2))) {
      uVar7 = this->m_order[uVar9];
      if ((int)uVar7 < 2) {
        if (text_log == (ON_TextLog *)0x0) {
LAB_005551d1:
          bVar2 = false;
        }
        else {
          bVar2 = false;
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",
                            uVar9 & 0xffffffff,(ulong)uVar7);
        }
      }
      else {
        cv_count = this->m_cv_count[uVar9];
        if ((int)cv_count < (int)uVar7) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_005551d1;
          bVar2 = false;
          ON_TextLog::Print(text_log,
                            "ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",
                            uVar9 & 0xffffffff,(ulong)cv_count,uVar9 & 0xffffffff);
        }
        else if (this->m_knot[uVar9] == (double *)0x0) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_005551d1;
          bVar2 = false;
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
        else {
          bVar2 = ON_IsValidKnotVector(uVar7,cv_count,this->m_knot[uVar9],text_log);
          if (bVar2) {
            bVar2 = (int)((this->m_dim + 1) - (uint)(this->m_is_rat == 0)) <=
                    this->m_cv_stride[uVar9];
            if (text_log != (ON_TextLog *)0x0 && !bVar2) {
              bVar2 = false;
              ON_TextLog::Print(text_log,
                                "ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n"
                                ,uVar9 & 0xffffffff);
            }
          }
          else {
            if (text_log == (ON_TextLog *)0x0) goto LAB_005551d1;
            bVar2 = false;
            ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",
                              uVar9 & 0xffffffff);
          }
        }
      }
      uVar9 = uVar9 + 1;
    }
    if (!bVar2) {
      return bVar2;
    }
    iVar3 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
    if (this->m_cv_stride[0] < iVar3) {
      iVar8 = this->m_cv_stride[1];
    }
    else {
      iVar8 = this->m_cv_stride[1];
      if (this->m_cv_count[0] * iVar3 <= iVar8) goto LAB_00555274;
    }
    if (iVar3 <= iVar8 && this->m_cv_count[1] * iVar3 <= this->m_cv_stride[0]) {
LAB_00555274:
      uVar7 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
      uVar6 = 0;
      uVar9 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar9 = uVar6;
      }
      iVar3 = this->m_cv_count[1];
      if (this->m_cv_count[1] < 1) {
        iVar3 = 0;
      }
      uVar4 = (ulong)(uint)this->m_cv_count[0];
      if (this->m_cv_count[0] < 1) {
        uVar4 = uVar6;
      }
      do {
        iVar8 = (int)uVar6;
        if (iVar8 == (int)uVar4) {
          return bVar2;
        }
        for (j = 0; j != iVar3; j = j + 1) {
          pdVar5 = CV(this,iVar8,j);
          uVar6 = 0;
          while (uVar9 != uVar6) {
            pdVar1 = pdVar5 + uVar6;
            uVar6 = uVar6 + 1;
            if (1e+307 <= ABS(*pdVar1)) {
              return false;
            }
          }
        }
        uVar6 = (ulong)(iVar8 + 1);
      } while( true );
    }
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n");
      return false;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::IsValid( ON_TextLog* text_log ) const
{
  bool rc = false;

  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_dim = %d (should be > 0).\n",m_dim);
    }
  }
  else if ( m_cv == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_cv is nullptr.\n",m_dim);
    }
  }
  else
  {
    rc = true;
    for ( int i = 0; i < 2 && rc; i++ )
    {
      rc = false;
      if (m_order[i] < 2 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",i,m_order[i]);
        }
      }
      else if (m_cv_count[i] < m_order[i] )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",i,m_cv_count[i],i,m_order[i]);
        }
      }
      else if (m_knot[i] == nullptr)
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
      }
      else if ( !ON_IsValidKnotVector( m_order[i], m_cv_count[i], m_knot[i], text_log ) )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",i);
        }
      }
      else if ( m_cv_stride[i] < CVSize() )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n",i,m_cv_stride[i],CVSize());
        }
      }
      else
        rc = true;
    }
    if ( rc )
    {
      int a0 = CVSize();
      int a1 = m_cv_count[0]*a0;
      int b1 = CVSize();
      int b0 = m_cv_count[1]*b1;
      if ( m_cv_stride[0] < a0 || m_cv_stride[1] < a1 )
      {
        if ( m_cv_stride[0] < b0 || m_cv_stride[1] < b1 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n",m_cv_stride[0],m_cv_stride[1]);
          }
          rc = false;
        }
      }
    }

    if (rc)
    {
      const int cvdim = CVSize();
      for (int i = 0; m_cv_count[0] > i; ++i)
      {
        for (int j = 0; m_cv_count[1] > j; ++j)
        {
          const double* cv = CV(i, j);
          for (int k = 0; cvdim > k; ++k)
          {
            if (false == ON_CV_COORDINATE_IS_VALID(cv[k]))
              return false;
          }
        }
      }
    }
  }

  return rc;
}